

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Type * __thiscall
kj::_::NullableValue<capnp::Type>::emplace<capnp::Type>
          (NullableValue<capnp::Type> *this,Type *params)

{
  Type *params_00;
  Type *params_local;
  NullableValue<capnp::Type> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<capnp::Type>(&(this->field_1).value);
  }
  params_00 = fwd<capnp::Type>(params);
  ctor<capnp::Type,capnp::Type>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (Type *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }